

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O2

bool EV_TeleportOther(int other_tid,int dest_tid,bool fog)

{
  bool bVar1;
  AActor *thing;
  bool bVar2;
  FActorIterator iterator;
  
  if (dest_tid == 0 || other_tid == 0) {
    bVar2 = false;
  }
  else {
    iterator.base = (AActor *)0x0;
    bVar2 = false;
    iterator.id = other_tid;
    while( true ) {
      thing = FActorIterator::Next(&iterator);
      if (thing == (AActor *)0x0) break;
      bVar1 = EV_Teleport(dest_tid,0,(line_t_conflict *)0x0,0,thing,4 - (uint)fog);
      bVar2 = (bool)(bVar2 | bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool EV_TeleportOther (int other_tid, int dest_tid, bool fog)
{
	bool didSomething = false;

	if (other_tid != 0 && dest_tid != 0)
	{
		AActor *victim;
		FActorIterator iterator (other_tid);

		while ( (victim = iterator.Next ()) )
		{
			didSomething |= EV_Teleport (dest_tid, 0, NULL, 0, victim,
				fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
		}
	}

	return didSomething;
}